

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_shift(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  jx9_hashmap_node *pNode;
  int iVar2;
  jx9_value *pValue;
  int local_44;
  sxu32 n;
  jx9_value *pObj;
  jx9_hashmap_node *pEntry;
  jx9_hashmap *pMap;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 1) {
    jx9_result_null(pCtx);
  }
  else {
    iVar2 = jx9_value_is_json_array(*apArg);
    if (iVar2 == 0) {
      jx9_result_null(pCtx);
    }
    else {
      lVar1 = ((*apArg)->x).iVal;
      if (*(int *)(lVar1 + 0x2c) == 0) {
        jx9_result_null(pCtx);
      }
      else {
        pNode = *(jx9_hashmap_node **)(lVar1 + 0x10);
        pValue = HashmapExtractNodeValue(pNode);
        if (pValue == (jx9_value *)0x0) {
          jx9_result_null(pCtx);
        }
        else {
          jx9_result_value(pCtx,pValue);
          jx9HashmapUnlinkNode(pNode);
        }
        local_44 = *(int *)(lVar1 + 0x2c);
        pObj = *(jx9_value **)(lVar1 + 0x10);
        *(undefined8 *)(lVar1 + 0x48) = 0;
        for (; local_44 != 0; local_44 = local_44 + -1) {
          if (pObj->iFlags == 1) {
            HashmapRehashIntNode((jx9_hashmap_node *)pObj);
          }
          pObj = *(jx9_value **)&pObj[1].iFlags;
        }
        *(undefined8 *)(lVar1 + 0x20) = *(undefined8 *)(lVar1 + 0x10);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9_hashmap_shift(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	if( nArg < 1 ){
		/* Missing arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Point to the internal representation of the hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry < 1 ){
		/* Empty hashmap, return NULL */
		jx9_result_null(pCtx);
	}else{
		jx9_hashmap_node *pEntry = pMap->pFirst;
		jx9_value *pObj;
		sxu32 n;
		pObj = HashmapExtractNodeValue(pEntry);
		if( pObj ){
			/* Node value */
			jx9_result_value(pCtx, pObj);
			/* Unlink the first node */
			jx9HashmapUnlinkNode(pEntry);
		}else{
			jx9_result_null(pCtx);
		}
		/* Rehash all int keys */
		n = pMap->nEntry;
		pEntry = pMap->pFirst;
		pMap->iNextIdx = 0; /* Reset the automatic index */
		for(;;){
			if( n < 1 ){
				break;
			}
			if( pEntry->iType == HASHMAP_INT_NODE ){
				HashmapRehashIntNode(pEntry);
			}
			/* Point to the next entry */
			pEntry = pEntry->pPrev; /* Reverse link */
			n--;
		}
		/* Reset the cursor */
		pMap->pCur = pMap->pFirst;
	}
	return JX9_OK;
}